

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O2

void __thiscall tcu::GenericFactoryRegistry::~GenericFactoryRegistry(GenericFactoryRegistry *this)

{
  pointer ppAVar1;
  
  for (ppAVar1 = (this->m_factories).
                 super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 !=
      (this->m_factories).
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
    if (*ppAVar1 != (AbstractFactory *)0x0) {
      (*(*ppAVar1)->_vptr_AbstractFactory[1])();
    }
  }
  std::_Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>::~_Vector_base
            ((_Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_> *)this);
  return;
}

Assistant:

GenericFactoryRegistry::~GenericFactoryRegistry (void)
{
	for (std::vector<AbstractFactory*>::const_iterator i = m_factories.begin(); i != m_factories.end(); ++i)
		delete *i;
}